

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.hh
# Opt level: O2

void __thiscall Typelib::BadName::BadName(BadName *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,name," is not a valid type name");
  RegistryException::RegistryException(&this->super_RegistryException,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  *(undefined ***)&this->super_RegistryException = &PTR__BadName_0016b110;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

BadName(const std::string& name)
            : RegistryException(name + " is not a valid type name")
            , m_name(name) {}